

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::
     class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_&>,_(pybind11::return_value_policy)6,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_&>_>
     ::init_holder(instance *inst,value_and_holder *v_h,holder_type *holder_ptr,void *param_4)

{
  unique_ptr<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,std::default_delete<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>>>
  *this;
  iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_&>,_(pybind11::return_value_policy)6,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_&>
  **ppiVar1;
  void *param_3_local;
  holder_type *holder_ptr_local;
  value_and_holder *v_h_local;
  instance *inst_local;
  
  if (holder_ptr == (holder_type *)0x0) {
    if ((inst->field_0x30 & 1) != 0) {
      this = (unique_ptr<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,std::default_delete<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>>>
              *)pybind11::detail::value_and_holder::
                holder<std::unique_ptr<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,std::default_delete<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>>>>
                          (v_h);
      ppiVar1 = pybind11::detail::value_and_holder::
                value_ptr<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>>
                          (v_h);
      std::
      unique_ptr<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,std::default_delete<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>>>
      ::
      unique_ptr<std::default_delete<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>>,void>
                (this,*ppiVar1);
      pybind11::detail::value_and_holder::set_holder_constructed(v_h,true);
    }
  }
  else {
    init_holder_from_existing(v_h,holder_ptr);
    pybind11::detail::value_and_holder::set_holder_constructed(v_h,true);
  }
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type *holder_ptr, const void * /* dummy -- not enable_shared_from_this<T>) */) {
        if (holder_ptr) {
            init_holder_from_existing(v_h, holder_ptr, std::is_copy_constructible<holder_type>());
            v_h.set_holder_constructed();
        } else if (inst->owned || detail::always_construct_holder<holder_type>::value) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }